

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

void __thiscall llama_context::synchronize(llama_context *this)

{
  pointer pgVar1;
  long lVar2;
  unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *in_RDI;
  
  pgVar1 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get(in_RDI);
  ggml_backend_sched_synchronize(pgVar1);
  if (in_RDI[0x71]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
      super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl == (ggml_backend_sched *)0x1)
  {
    if (((ulong)in_RDI[8]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
                ._M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl & 0x100000000) == 0)
    {
      lVar2 = ggml_time_us();
      in_RDI[0x6f]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
      super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl =
           in_RDI[0x6f]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>.
           _M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
           super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl +
           (lVar2 - (long)in_RDI[0x70]._M_t.
                          super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t
                          .super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                          super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    }
    *(int *)((long)&in_RDI[0x72]._M_t.
                    super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                    super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                    super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl + 4) =
         *(int *)((long)&in_RDI[0x72]._M_t.
                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                         super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl + 4) + 1;
  }
  else if (1 < (long)in_RDI[0x71]._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl) {
    if (((ulong)in_RDI[8]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
                ._M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl & 0x100000000) == 0)
    {
      lVar2 = ggml_time_us();
      in_RDI[0x6e]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
      super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl =
           in_RDI[0x6e]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>.
           _M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
           super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl +
           (lVar2 - (long)in_RDI[0x70]._M_t.
                          super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t
                          .super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                          super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    }
    *(int *)&in_RDI[0x72]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
             ._M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl =
         *(int *)&in_RDI[0x72]._M_t.
                  super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                  super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl +
         (int)in_RDI[0x71]._M_t.
              super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
              super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
              super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl;
  }
  if ((0 < (long)in_RDI[0x71]._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl) &&
     (((ulong)in_RDI[0x6b]._M_t.
              super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
              super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
              super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl & 1) == 0)) {
    lVar2 = ggml_time_us();
    in_RDI[0x6d]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
    super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
    super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl =
         (ggml_backend_sched *)
         (lVar2 - (long)in_RDI[0x6c]._M_t.
                        super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                        super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                        super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
    *(undefined1 *)
     &in_RDI[0x6b]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
      super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl = 1;
  }
  in_RDI[0x71]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
  super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl = (ggml_backend_sched *)0x0;
  in_RDI[0x70]._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
  super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl = (ggml_backend_sched *)0x0;
  return;
}

Assistant:

void llama_context::synchronize() {
    ggml_backend_sched_synchronize(sched.get());

    // FIXME: if multiple single tokens are evaluated without a synchronization,
    // the stats will be added to the prompt evaluation stats
    // this should only happen when using batch size 1 to evaluate a batch

    // add the evaluation to the stats
    if (n_queued_tokens == 1) {
        if (!cparams.no_perf) {
            t_eval_us += ggml_time_us() - t_compute_start_us;
        }
        n_eval++;
    } else if (n_queued_tokens > 1) {
        if (!cparams.no_perf) {
            t_p_eval_us += ggml_time_us() - t_compute_start_us;
        }
        n_p_eval += n_queued_tokens;
    }

    // get a more accurate load time, upon first eval
    if (n_queued_tokens > 0 && !has_evaluated_once) {
        t_load_us = ggml_time_us() - t_start_us;
        has_evaluated_once = true;
    }

    n_queued_tokens = 0;
    t_compute_start_us = 0;
}